

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O1

void qDrawBorderPixmap(QPainter *painter,QRect *targetRect,QMargins *targetMargins,QPixmap *pixmap,
                      QRect *sourceRect,QMargins *sourceMargins,QTileRules *rules,DrawingHints hints
                      )

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar9;
  QVLABase<QPainter::PixmapFragment> *pQVar15;
  void *pvVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  long *plVar22;
  ulong uVar23;
  QVLABase<QPainter::PixmapFragment> *pQVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  undefined1 *puVar28;
  ulong uVar29;
  QVLABase<QPainter::PixmapFragment> *pQVar30;
  int i;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  qreal *pqVar34;
  PixmapFragment *pPVar35;
  char cVar36;
  PixmapFragment *pPVar37;
  uint uVar38;
  int iVar39;
  int iVar40;
  long in_FS_OFFSET;
  bool bVar41;
  byte bVar42;
  uint uVar43;
  uint uVar48;
  double dVar44;
  double dVar45;
  double dVar46;
  undefined1 auVar47 [16];
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar54;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  QVarLengthArray<double,_16LL> yTarget;
  QVarLengthArray<double,_16LL> xTarget;
  QPixmapFragmentsArray translucentData;
  QPixmapFragmentsArray opaqueData;
  undefined1 local_c38 [40];
  undefined8 uStack_c10;
  undefined1 local_c08 [12];
  undefined4 uStack_bfc;
  qreal local_bf8;
  qreal qStack_bf0;
  QVLABase<double> local_be8;
  double local_bd0 [16];
  QVLABase<double> local_b50;
  double local_b38 [16];
  QVLABase<QPainter::PixmapFragment> local_ab8;
  undefined1 local_aa0 [1280];
  QVLABase<QPainter::PixmapFragment> local_5a0;
  undefined1 local_588 [1280];
  PixmapFragment local_88;
  long local_38;
  
  bVar42 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c08._8_4_ = 0xffffffff;
  local_c08._0_8_ = 0xffffffffffffffff;
  uStack_bfc = 0xffffffff;
  uStack_c10._0_4_ = 0xffffffff;
  local_c38._32_8_ = 0xffffffffffffffff;
  uStack_c10._4_4_ = 0xffffffff;
  local_c38._16_8_ = -NAN;
  local_c38._24_8_ = -NAN;
  local_c38._0_8_ = -NAN;
  local_c38._8_8_ = -NAN;
  local_bf8 = 0.0;
  qStack_bf0 = 1.0;
  memset(&local_5a0,0xaa,0x518);
  local_5a0.super_QVLABaseBase.a = 0x10;
  local_5a0.super_QVLABaseBase.s = 0;
  local_5a0.super_QVLABaseBase.ptr = local_588;
  memset(&local_ab8,0xaa,0x518);
  local_ab8.super_QVLABaseBase.a = 0x10;
  local_ab8.super_QVLABaseBase.s = 0;
  local_ab8.super_QVLABaseBase.ptr = local_aa0;
  uVar4 = sourceRect->x1;
  uVar10 = sourceRect->y1;
  uVar5 = sourceMargins->m_left;
  uVar11 = sourceMargins->m_top;
  iVar49 = uVar5 + uVar4;
  iVar50 = uVar11 + uVar10;
  uVar6 = sourceRect->x2;
  uVar12 = sourceRect->y2;
  uVar7 = sourceMargins->m_right;
  uVar13 = sourceMargins->m_bottom;
  iVar51 = (uVar6 - uVar7) + 1;
  iVar54 = (uVar12 - uVar13) + 1;
  uVar43 = iVar51 - iVar49;
  uVar48 = iVar54 - iVar50;
  iVar39 = (targetMargins->m_top).m_i + (targetRect->y1).m_i;
  iVar25 = (targetMargins->m_left).m_i + (targetRect->x1).m_i;
  iVar17 = ((targetRect->y2).m_i - (targetMargins->m_bottom).m_i) + 1;
  iVar40 = ((targetRect->x2).m_i - (targetMargins->m_right).m_i) + 1;
  iVar18 = iVar40 - iVar25;
  memset(&local_b50,0xaa,0x98);
  local_b50.super_QVLABaseBase.a = 0x10;
  local_b50.super_QVLABaseBase.s = 0;
  local_b50.super_QVLABaseBase.ptr = local_b38;
  memset(&local_be8,0xaa,0x98);
  local_be8.super_QVLABaseBase.a = 0x10;
  local_be8.super_QVLABaseBase.s = 0;
  local_be8.super_QVLABaseBase.ptr = local_bd0;
  uVar38 = 3;
  uVar31 = 3;
  if ((rules->horizontal != StretchTile) && (uVar31 = 3, (bool)(~(iVar51 == iVar49) & 1))) {
    dVar44 = ceil((double)iVar18 / (double)(int)uVar43);
    iVar19 = 1;
    if (1 < (int)dVar44) {
      iVar19 = (int)dVar44;
    }
    uVar31 = iVar19 + 2;
  }
  iVar19 = iVar17 - iVar39;
  if ((rules->vertical != StretchTile) &&
     (((-(ushort)(iVar54 == iVar50) ^ DAT_0066f590._4_2_) & 1) != 0)) {
    dVar44 = ceil((double)iVar19 / (double)(int)uVar48);
    iVar21 = 1;
    if (1 < (int)dVar44) {
      iVar21 = (int)dVar44;
    }
    uVar38 = iVar21 + 2;
  }
  uVar29 = (ulong)(uVar31 + 1);
  uVar23 = 0x10;
  if (0x10 < uVar29) {
    uVar23 = uVar29;
  }
  QVLABase<double>::reallocate_impl(&local_b50,0x10,local_b38,uVar29,uVar23);
  uVar27 = (ulong)(uVar38 + 1);
  uVar23 = local_be8.super_QVLABaseBase.a;
  if (local_be8.super_QVLABaseBase.a <= (long)uVar27) {
    uVar23 = uVar27;
  }
  local_b50.super_QVLABaseBase.s = uVar29;
  QVLABase<double>::reallocate_impl(&local_be8,0x10,local_bd0,uVar27,uVar23);
  local_be8.super_QVLABaseBase.s = uVar27;
  uVar20 = QPainter::renderHints();
  plVar22 = (long *)QPainter::paintEngine();
  iVar21 = (**(code **)(*plVar22 + 0xa8))(plVar22);
  if (iVar21 != 6) {
    plVar22 = (long *)QPainter::paintEngine();
    iVar21 = (**(code **)(*plVar22 + 0xa8))(plVar22);
    if (((uVar20 & 1) != 0) && (iVar21 != 0xd)) {
      QPainter::combinedTransform();
      iVar21 = QTransform::type();
      if (iVar21 != 0) {
        QPainter::setRenderHint((RenderHint)painter,true);
      }
    }
  }
  pvVar16 = local_b50.super_QVLABaseBase.ptr;
  dVar44 = (double)iVar18;
  iVar21 = (targetRect->x1).m_i;
  *(double *)local_b50.super_QVLABaseBase.ptr = (double)iVar21;
  *(double *)((long)local_b50.super_QVLABaseBase.ptr + 8) = (double)iVar25;
  uVar1 = uVar31 - 1;
  uVar29 = (ulong)uVar1;
  *(double *)((long)local_b50.super_QVLABaseBase.ptr + uVar29 * 8) = (double)iVar40;
  *(double *)((long)local_b50.super_QVLABaseBase.ptr + (ulong)uVar31 * 8) =
       (double)(((iVar21 + (targetRect->x2).m_i) - (targetRect->x1).m_i) + 1);
  iVar25 = (targetRect->y1).m_i;
  *(double *)local_be8.super_QVLABaseBase.ptr = (double)iVar25;
  *(double *)((long)local_be8.super_QVLABaseBase.ptr + 8) = (double)iVar39;
  uVar2 = uVar38 - 1;
  uVar23 = (ulong)uVar2;
  *(double *)((long)local_be8.super_QVLABaseBase.ptr + uVar23 * 8) = (double)iVar17;
  *(double *)((long)local_be8.super_QVLABaseBase.ptr + (ulong)uVar38 * 8) =
       (double)(((iVar25 + (targetRect->y2).m_i) - (targetRect->y1).m_i) + 1);
  if (rules->horizontal == RoundTile) {
    dVar44 = dVar44 / (double)(int)(uVar31 - 2);
  }
  else if (rules->horizontal == RepeatTile) {
    dVar44 = (double)(int)uVar43;
  }
  if (3 < (int)uVar31) {
    dVar45 = *(double *)((long)pvVar16 + 8);
    uVar27 = 2;
    do {
      dVar45 = dVar45 + dVar44;
      *(double *)((long)pvVar16 + uVar27 * 8) = dVar45;
      uVar27 = uVar27 + 1;
    } while (uVar29 != uVar27);
  }
  if (rules->vertical == RepeatTile) {
    dVar45 = (double)(int)uVar48;
  }
  else {
    dVar45 = (double)iVar19;
    if (rules->vertical == RoundTile) {
      dVar45 = dVar45 / (double)(int)(uVar38 - 2);
    }
  }
  if (3 < (int)uVar38) {
    dVar46 = *(double *)((long)local_be8.super_QVLABaseBase.ptr + 8);
    uVar27 = 2;
    do {
      dVar46 = dVar46 + dVar45;
      *(double *)((long)local_be8.super_QVLABaseBase.ptr + uVar27 * 8) = dVar46;
      uVar27 = uVar27 + 1;
    } while (uVar23 != uVar27);
  }
  if ((((0 < (targetMargins->m_top).m_i) && (0 < (targetMargins->m_left).m_i)) &&
      (iVar17 = (sourceMargins->m_top).m_i, 0 < iVar17)) &&
     (iVar25 = (sourceMargins->m_left).m_i, 0 < iVar25)) {
    local_c38._0_8_ = (*(double *)((long)pvVar16 + 8) + *pvVar16) * 0.5;
    local_c38._8_8_ =
         (*(double *)((long)local_be8.super_QVLABaseBase.ptr + 8) +
         *local_be8.super_QVLABaseBase.ptr) * 0.5;
    uVar8 = sourceRect->x1;
    uVar14 = sourceRect->y1;
    local_c38._16_8_ = (double)(int)uVar8;
    local_c38._24_8_ = (double)(int)uVar14;
    local_c38._32_8_ = (undefined8)iVar25;
    uStack_c10 = (double)iVar17;
    stack0xfffffffffffff400 =
         (*(double *)((long)local_be8.super_QVLABaseBase.ptr + 8) -
         *local_be8.super_QVLABaseBase.ptr) / uStack_c10;
    local_c08._0_8_ = (*(double *)((long)pvVar16 + 8) - *pvVar16) / (double)local_c38._32_8_;
    if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
               super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 1) == 0) {
      if (local_ab8.super_QVLABaseBase.s != local_ab8.super_QVLABaseBase.a) {
        pQVar30 = &local_ab8;
        puVar28 = local_aa0;
LAB_00342313:
        QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                  (pQVar30,0x10,puVar28,(PixmapFragment *)local_c38);
        goto LAB_00342325;
      }
      pqVar34 = (qreal *)local_c38;
      pPVar35 = &local_88;
      for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
        pPVar35->x = *pqVar34;
        pqVar34 = pqVar34 + (ulong)bVar42 * -2 + 1;
        pPVar35 = (PixmapFragment *)((long)pPVar35 + ((ulong)bVar42 * -2 + 1) * 8);
      }
      pQVar30 = &local_ab8;
      puVar28 = local_aa0;
    }
    else {
      if (local_5a0.super_QVLABaseBase.s != local_5a0.super_QVLABaseBase.a) {
        pQVar30 = &local_5a0;
        puVar28 = local_588;
        goto LAB_00342313;
      }
      pqVar34 = (qreal *)local_c38;
      pPVar35 = &local_88;
      for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
        pPVar35->x = *pqVar34;
        pqVar34 = pqVar34 + (ulong)bVar42 * -2 + 1;
        pPVar35 = (PixmapFragment *)((long)pPVar35 + ((ulong)bVar42 * -2 + 1) * 8);
      }
      pQVar30 = &local_5a0;
      puVar28 = local_588;
    }
    QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
              (pQVar30,0x10,puVar28,&local_88);
  }
LAB_00342325:
  if (((0 < (targetMargins->m_top).m_i) && (0 < (targetMargins->m_right).m_i)) &&
     ((iVar17 = (sourceMargins->m_top).m_i, 0 < iVar17 &&
      (iVar25 = (sourceMargins->m_right).m_i, 0 < iVar25)))) {
    local_c38._0_8_ =
         (*(double *)((long)local_b50.super_QVLABaseBase.ptr + (ulong)uVar31 * 8) +
         *(double *)((long)local_b50.super_QVLABaseBase.ptr + uVar29 * 8)) * 0.5;
    local_c38._8_8_ =
         (*(double *)((long)local_be8.super_QVLABaseBase.ptr + 8) +
         *local_be8.super_QVLABaseBase.ptr) * 0.5;
    local_c38._16_8_ = (double)iVar51;
    local_c38._24_8_ = (double)(sourceRect->y1).m_i;
    local_c38._32_8_ = (undefined8)iVar25;
    uStack_c10 = (double)iVar17;
    stack0xfffffffffffff400 =
         (*(double *)((long)local_be8.super_QVLABaseBase.ptr + 8) -
         *local_be8.super_QVLABaseBase.ptr) / uStack_c10;
    local_c08._0_8_ =
         (*(double *)((long)local_b50.super_QVLABaseBase.ptr + (ulong)uVar31 * 8) -
         *(double *)((long)local_b50.super_QVLABaseBase.ptr + uVar29 * 8)) /
         (double)local_c38._32_8_;
    if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
               super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 4) == 0) {
      if (local_ab8.super_QVLABaseBase.s != local_ab8.super_QVLABaseBase.a) {
        pQVar30 = &local_ab8;
        puVar28 = local_aa0;
LAB_003424e2:
        QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                  (pQVar30,0x10,puVar28,(PixmapFragment *)local_c38);
        goto LAB_003424f4;
      }
      pqVar34 = (qreal *)local_c38;
      pPVar35 = &local_88;
      for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
        pPVar35->x = *pqVar34;
        pqVar34 = pqVar34 + (ulong)bVar42 * -2 + 1;
        pPVar35 = (PixmapFragment *)((long)pPVar35 + ((ulong)bVar42 * -2 + 1) * 8);
      }
      pQVar30 = &local_ab8;
      puVar28 = local_aa0;
    }
    else {
      if (local_5a0.super_QVLABaseBase.s != local_5a0.super_QVLABaseBase.a) {
        pQVar30 = &local_5a0;
        puVar28 = local_588;
        goto LAB_003424e2;
      }
      pqVar34 = (qreal *)local_c38;
      pPVar35 = &local_88;
      for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
        pPVar35->x = *pqVar34;
        pqVar34 = pqVar34 + (ulong)bVar42 * -2 + 1;
        pPVar35 = (PixmapFragment *)((long)pPVar35 + ((ulong)bVar42 * -2 + 1) * 8);
      }
      pQVar30 = &local_5a0;
      puVar28 = local_588;
    }
    QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
              (pQVar30,0x10,puVar28,&local_88);
  }
LAB_003424f4:
  if (((0 < (targetMargins->m_bottom).m_i) && (0 < (targetMargins->m_left).m_i)) &&
     ((iVar17 = (sourceMargins->m_bottom).m_i, 0 < iVar17 &&
      (iVar25 = (sourceMargins->m_left).m_i, 0 < iVar25)))) {
    local_c38._0_8_ =
         (*(double *)((long)local_b50.super_QVLABaseBase.ptr + 8) +
         *local_b50.super_QVLABaseBase.ptr) * 0.5;
    local_c38._8_8_ =
         (*(double *)((long)local_be8.super_QVLABaseBase.ptr + (ulong)uVar38 * 8) +
         *(double *)((long)local_be8.super_QVLABaseBase.ptr + uVar23 * 8)) * 0.5;
    local_c38._16_8_ = (double)(sourceRect->x1).m_i;
    local_c38._24_8_ = (double)iVar54;
    local_c38._32_8_ = (undefined8)iVar25;
    uStack_c10 = (double)iVar17;
    stack0xfffffffffffff400 =
         (*(double *)((long)local_be8.super_QVLABaseBase.ptr + (ulong)uVar38 * 8) -
         *(double *)((long)local_be8.super_QVLABaseBase.ptr + uVar23 * 8)) / uStack_c10;
    local_c08._0_8_ =
         (*(double *)((long)local_b50.super_QVLABaseBase.ptr + 8) -
         *local_b50.super_QVLABaseBase.ptr) / (double)local_c38._32_8_;
    if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
               super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x40) == 0) {
      if (local_ab8.super_QVLABaseBase.s != local_ab8.super_QVLABaseBase.a) {
        pQVar30 = &local_ab8;
        puVar28 = local_aa0;
LAB_003426b5:
        QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                  (pQVar30,0x10,puVar28,(PixmapFragment *)local_c38);
        goto LAB_003426c7;
      }
      pqVar34 = (qreal *)local_c38;
      pPVar35 = &local_88;
      for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
        pPVar35->x = *pqVar34;
        pqVar34 = pqVar34 + (ulong)bVar42 * -2 + 1;
        pPVar35 = (PixmapFragment *)((long)pPVar35 + ((ulong)bVar42 * -2 + 1) * 8);
      }
      pQVar30 = &local_ab8;
      puVar28 = local_aa0;
    }
    else {
      if (local_5a0.super_QVLABaseBase.s != local_5a0.super_QVLABaseBase.a) {
        pQVar30 = &local_5a0;
        puVar28 = local_588;
        goto LAB_003426b5;
      }
      pqVar34 = (qreal *)local_c38;
      pPVar35 = &local_88;
      for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
        pPVar35->x = *pqVar34;
        pqVar34 = pqVar34 + (ulong)bVar42 * -2 + 1;
        pPVar35 = (PixmapFragment *)((long)pPVar35 + ((ulong)bVar42 * -2 + 1) * 8);
      }
      pQVar30 = &local_5a0;
      puVar28 = local_588;
    }
    QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
              (pQVar30,0x10,puVar28,&local_88);
  }
LAB_003426c7:
  if (((((targetMargins->m_bottom).m_i < 1) || ((targetMargins->m_right).m_i < 1)) ||
      (iVar17 = (sourceMargins->m_bottom).m_i, iVar17 < 1)) ||
     (iVar25 = (sourceMargins->m_right).m_i, iVar25 < 1)) goto LAB_00342895;
  local_c38._0_8_ =
       (*(double *)((long)local_b50.super_QVLABaseBase.ptr + (ulong)uVar31 * 8) +
       *(double *)((long)local_b50.super_QVLABaseBase.ptr + uVar29 * 8)) * 0.5;
  local_c38._8_8_ =
       (*(double *)((long)local_be8.super_QVLABaseBase.ptr + (ulong)uVar38 * 8) +
       *(double *)((long)local_be8.super_QVLABaseBase.ptr + uVar23 * 8)) * 0.5;
  local_c38._16_8_ = (double)iVar51;
  local_c38._24_8_ = (double)iVar54;
  local_c38._32_8_ = (undefined8)iVar25;
  uStack_c10 = (double)iVar17;
  stack0xfffffffffffff400 =
       (*(double *)((long)local_be8.super_QVLABaseBase.ptr + (ulong)uVar38 * 8) -
       *(double *)((long)local_be8.super_QVLABaseBase.ptr + uVar23 * 8)) / uStack_c10;
  local_c08._0_8_ =
       (*(double *)((long)local_b50.super_QVLABaseBase.ptr + (ulong)uVar31 * 8) -
       *(double *)((long)local_b50.super_QVLABaseBase.ptr + uVar29 * 8)) / (double)local_c38._32_8_;
  if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
             super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i >> 8 & 1) == 0) {
    if (local_ab8.super_QVLABaseBase.s != local_ab8.super_QVLABaseBase.a) {
      pQVar30 = &local_ab8;
      puVar28 = local_aa0;
LAB_00342883:
      QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                (pQVar30,0x10,puVar28,(PixmapFragment *)local_c38);
      goto LAB_00342895;
    }
    pqVar34 = (qreal *)local_c38;
    pPVar35 = &local_88;
    for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
      pPVar35->x = *pqVar34;
      pqVar34 = pqVar34 + (ulong)bVar42 * -2 + 1;
      pPVar35 = (PixmapFragment *)((long)pPVar35 + ((ulong)bVar42 * -2 + 1) * 8);
    }
    pQVar30 = &local_ab8;
    puVar28 = local_aa0;
  }
  else {
    if (local_5a0.super_QVLABaseBase.s != local_5a0.super_QVLABaseBase.a) {
      pQVar30 = &local_5a0;
      puVar28 = local_588;
      goto LAB_00342883;
    }
    pqVar34 = (qreal *)local_c38;
    pPVar35 = &local_88;
    for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
      pPVar35->x = *pqVar34;
      pqVar34 = pqVar34 + (ulong)bVar42 * -2 + 1;
      pPVar35 = (PixmapFragment *)((long)pPVar35 + ((ulong)bVar42 * -2 + 1) * 8);
    }
    pQVar30 = &local_5a0;
    puVar28 = local_588;
  }
  QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
            (pQVar30,0x10,puVar28,&local_88);
LAB_00342895:
  if ((0 < iVar18) && (0 < (int)uVar43)) {
    if ((0 < (targetMargins->m_top).m_i) && (iVar17 = (sourceMargins->m_top).m_i, 0 < iVar17)) {
      bVar41 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                      super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 2) == 0;
      pQVar30 = &local_5a0;
      if (bVar41) {
        pQVar30 = &local_ab8;
      }
      local_c38._16_8_ = (double)iVar49;
      local_c38._24_8_ = (double)(sourceRect->y1).m_i;
      uStack_c10 = (double)iVar17;
      local_c38._32_8_ = (double)(int)uVar43;
      local_c38._8_8_ =
           (*(double *)((long)local_be8.super_QVLABaseBase.ptr + 8) +
           *local_be8.super_QVLABaseBase.ptr) * 0.5;
      puVar28 = local_588;
      if (bVar41) {
        puVar28 = local_aa0;
      }
      uVar27 = 2;
      if (2 < (int)uVar1) {
        uVar27 = (ulong)uVar1;
      }
      stack0xfffffffffffff400 =
           (*(double *)((long)local_be8.super_QVLABaseBase.ptr + 8) -
           *local_be8.super_QVLABaseBase.ptr) / uStack_c10;
      local_c08._0_8_ = dVar44 / (double)(int)uVar43;
      uVar32 = 1;
      do {
        pQVar24 = &local_5a0;
        if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                   super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 2) == 0) {
          pQVar24 = &local_ab8;
        }
        local_c38._0_8_ =
             (*(double *)((long)local_b50.super_QVLABaseBase.ptr + (uVar32 + 1) * 8) +
             *(double *)((long)local_b50.super_QVLABaseBase.ptr + uVar32 * 8)) * 0.5;
        if ((pQVar24->super_QVLABaseBase).s == (pQVar30->super_QVLABaseBase).a) {
          pPVar35 = (PixmapFragment *)local_c38;
          pPVar37 = &local_88;
          for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
            pPVar37->x = pPVar35->x;
            pPVar35 = (PixmapFragment *)((long)pPVar35 + (ulong)bVar42 * -0x10 + 8);
            pPVar37 = (PixmapFragment *)((long)pPVar37 + (ulong)bVar42 * -0x10 + 8);
          }
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
                    (pQVar30,0x10,puVar28,&local_88);
        }
        else {
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                    (pQVar30,0x10,puVar28,(PixmapFragment *)local_c38);
        }
        uVar32 = uVar32 + 1;
      } while (uVar27 != uVar32);
      if (rules->horizontal == RepeatTile) {
        bVar41 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                        super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 2) == 0;
        pQVar30 = &local_5a0;
        if (bVar41) {
          pQVar30 = &local_ab8;
        }
        pQVar24 = &local_5a0;
        if (bVar41) {
          pQVar24 = &local_ab8;
        }
        *(double *)
         ((long)(pQVar24->super_QVLABaseBase).ptr + (pQVar30->super_QVLABaseBase).s * 0x50 + -0x30)
             = (*(double *)((long)local_b50.super_QVLABaseBase.ptr + uVar29 * 8) -
               *(double *)((long)local_b50.super_QVLABaseBase.ptr + ((ulong)uVar31 - 2) * 8)) /
               (double)local_c08._0_8_;
      }
    }
    if ((0 < (targetMargins->m_bottom).m_i) && (iVar17 = (sourceMargins->m_bottom).m_i, 0 < iVar17))
    {
      cVar36 = (char)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                     super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i;
      pQVar30 = &local_5a0;
      if (-1 < cVar36) {
        pQVar30 = &local_ab8;
      }
      local_c38._16_8_ = (double)iVar49;
      local_c38._24_8_ = (double)iVar54;
      uStack_c10 = (double)iVar17;
      local_c38._32_8_ = (double)(int)uVar43;
      local_c38._8_8_ =
           (*(double *)((long)local_be8.super_QVLABaseBase.ptr + (ulong)uVar38 * 8) +
           *(double *)((long)local_be8.super_QVLABaseBase.ptr + uVar23 * 8)) * 0.5;
      puVar28 = local_588;
      if (-1 < cVar36) {
        puVar28 = local_aa0;
      }
      uVar27 = 2;
      if (2 < (int)uVar1) {
        uVar27 = uVar29;
      }
      stack0xfffffffffffff400 =
           (*(double *)((long)local_be8.super_QVLABaseBase.ptr + (ulong)uVar38 * 8) -
           *(double *)((long)local_be8.super_QVLABaseBase.ptr + uVar23 * 8)) / uStack_c10;
      local_c08._0_8_ = dVar44 / (double)(int)uVar43;
      uVar32 = 1;
      do {
        pQVar24 = &local_5a0;
        if (-1 < cVar36) {
          pQVar24 = &local_ab8;
        }
        local_c38._0_8_ =
             (*(double *)((long)local_b50.super_QVLABaseBase.ptr + (uVar32 + 1) * 8) +
             *(double *)((long)local_b50.super_QVLABaseBase.ptr + uVar32 * 8)) * 0.5;
        if ((pQVar24->super_QVLABaseBase).s == (pQVar30->super_QVLABaseBase).a) {
          pPVar35 = (PixmapFragment *)local_c38;
          pPVar37 = &local_88;
          for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
            pPVar37->x = pPVar35->x;
            pPVar35 = (PixmapFragment *)((long)pPVar35 + (ulong)bVar42 * -0x10 + 8);
            pPVar37 = (PixmapFragment *)((long)pPVar37 + (ulong)bVar42 * -0x10 + 8);
          }
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
                    (pQVar30,0x10,puVar28,&local_88);
        }
        else {
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                    (pQVar30,0x10,puVar28,(PixmapFragment *)local_c38);
        }
        uVar32 = uVar32 + 1;
      } while (uVar27 != uVar32);
      if (rules->horizontal == RepeatTile) {
        pQVar30 = &local_5a0;
        if (-1 < cVar36) {
          pQVar30 = &local_ab8;
        }
        pQVar24 = &local_5a0;
        if (-1 < cVar36) {
          pQVar24 = &local_ab8;
        }
        *(double *)
         ((long)(pQVar24->super_QVLABaseBase).ptr + (pQVar30->super_QVLABaseBase).s * 0x50 + -0x30)
             = (*(double *)((long)local_b50.super_QVLABaseBase.ptr + uVar29 * 8) -
               *(double *)((long)local_b50.super_QVLABaseBase.ptr + ((ulong)uVar31 - 2) * 8)) /
               (double)local_c08._0_8_;
      }
    }
  }
  if ((0 < iVar19) && (0 < (int)uVar48)) {
    if ((0 < (targetMargins->m_left).m_i) && (iVar17 = (sourceMargins->m_left).m_i, 0 < iVar17)) {
      bVar41 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                      super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 8) == 0;
      pQVar30 = &local_5a0;
      if (bVar41) {
        pQVar30 = &local_ab8;
      }
      auVar56._0_8_ = (double)iVar17;
      local_c38._16_8_ = (double)(sourceRect->x1).m_i;
      local_c38._24_8_ = (double)iVar50;
      uStack_c10 = (double)(int)uVar48;
      local_c38._32_8_ = auVar56._0_8_;
      local_c38._0_8_ =
           (*local_b50.super_QVLABaseBase.ptr +
           *(double *)((long)local_b50.super_QVLABaseBase.ptr + 8)) * 0.5;
      auVar52._0_8_ =
           *(double *)((long)local_b50.super_QVLABaseBase.ptr + 8) -
           *local_b50.super_QVLABaseBase.ptr;
      auVar52._8_8_ = dVar45;
      auVar56._8_8_ = (double)(int)uVar48;
      _local_c08 = divpd(auVar52,auVar56);
      puVar28 = local_588;
      if (bVar41) {
        puVar28 = local_aa0;
      }
      uVar27 = 2;
      if (2 < (int)uVar2) {
        uVar27 = uVar23;
      }
      uVar32 = 1;
      do {
        pQVar24 = &local_5a0;
        if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                   super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 8) == 0) {
          pQVar24 = &local_ab8;
        }
        local_c38._8_8_ =
             (*(double *)((long)local_be8.super_QVLABaseBase.ptr + (uVar32 + 1) * 8) +
             *(double *)((long)local_be8.super_QVLABaseBase.ptr + uVar32 * 8)) * 0.5;
        if ((pQVar24->super_QVLABaseBase).s == (pQVar30->super_QVLABaseBase).a) {
          pPVar35 = (PixmapFragment *)local_c38;
          pPVar37 = &local_88;
          for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
            pPVar37->x = pPVar35->x;
            pPVar35 = (PixmapFragment *)((long)pPVar35 + (ulong)bVar42 * -0x10 + 8);
            pPVar37 = (PixmapFragment *)((long)pPVar37 + (ulong)bVar42 * -0x10 + 8);
          }
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
                    (pQVar30,0x10,puVar28,&local_88);
        }
        else {
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                    (pQVar30,0x10,puVar28,(PixmapFragment *)local_c38);
        }
        uVar32 = uVar32 + 1;
      } while (uVar27 != uVar32);
      if (rules->vertical == RepeatTile) {
        bVar41 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                        super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 8) == 0;
        pQVar30 = &local_5a0;
        if (bVar41) {
          pQVar30 = &local_ab8;
        }
        pQVar24 = &local_5a0;
        if (bVar41) {
          pQVar24 = &local_ab8;
        }
        *(double *)
         ((long)(pQVar24->super_QVLABaseBase).ptr + (pQVar30->super_QVLABaseBase).s * 0x50 + -0x28)
             = (*(double *)((long)local_be8.super_QVLABaseBase.ptr + uVar23 * 8) -
               *(double *)((long)local_be8.super_QVLABaseBase.ptr + ((ulong)uVar38 - 2) * 8)) /
               stack0xfffffffffffff400;
      }
    }
    if ((0 < (targetMargins->m_right).m_i) && (iVar17 = (sourceMargins->m_right).m_i, 0 < iVar17)) {
      bVar41 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                      super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x20) == 0;
      pQVar30 = &local_5a0;
      if (bVar41) {
        pQVar30 = &local_ab8;
      }
      local_c38._16_8_ = (double)iVar51;
      local_c38._24_8_ = (double)iVar50;
      auVar47._0_8_ = (double)iVar17;
      uStack_c10 = (double)(int)uVar48;
      local_c38._32_8_ = auVar47._0_8_;
      local_c38._0_8_ =
           (*(double *)((long)local_b50.super_QVLABaseBase.ptr + (ulong)uVar31 * 8) +
           *(double *)((long)local_b50.super_QVLABaseBase.ptr + uVar29 * 8)) * 0.5;
      auVar53._0_8_ =
           *(double *)((long)local_b50.super_QVLABaseBase.ptr + (ulong)uVar31 * 8) -
           *(double *)((long)local_b50.super_QVLABaseBase.ptr + uVar29 * 8);
      auVar53._8_8_ = dVar45;
      auVar47._8_8_ = (double)(int)uVar48;
      _local_c08 = divpd(auVar53,auVar47);
      puVar28 = local_588;
      if (bVar41) {
        puVar28 = local_aa0;
      }
      uVar27 = 2;
      if (2 < (int)uVar2) {
        uVar27 = uVar23;
      }
      uVar32 = 1;
      do {
        pQVar24 = &local_5a0;
        if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                   super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x20) == 0) {
          pQVar24 = &local_ab8;
        }
        local_c38._8_8_ =
             (*(double *)((long)local_be8.super_QVLABaseBase.ptr + (uVar32 + 1) * 8) +
             *(double *)((long)local_be8.super_QVLABaseBase.ptr + uVar32 * 8)) * 0.5;
        if ((pQVar24->super_QVLABaseBase).s == (pQVar30->super_QVLABaseBase).a) {
          pPVar35 = (PixmapFragment *)local_c38;
          pPVar37 = &local_88;
          for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
            pPVar37->x = pPVar35->x;
            pPVar35 = (PixmapFragment *)((long)pPVar35 + (ulong)bVar42 * -0x10 + 8);
            pPVar37 = (PixmapFragment *)((long)pPVar37 + (ulong)bVar42 * -0x10 + 8);
          }
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
                    (pQVar30,0x10,puVar28,&local_88);
        }
        else {
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                    (pQVar30,0x10,puVar28,(PixmapFragment *)local_c38);
        }
        uVar32 = uVar32 + 1;
      } while (uVar27 != uVar32);
      if (rules->vertical == RepeatTile) {
        bVar41 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                        super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x20) == 0;
        pQVar30 = &local_5a0;
        if (bVar41) {
          pQVar30 = &local_ab8;
        }
        pQVar24 = &local_5a0;
        if (bVar41) {
          pQVar24 = &local_ab8;
        }
        *(double *)
         ((long)(pQVar24->super_QVLABaseBase).ptr + (pQVar30->super_QVLABaseBase).s * 0x50 + -0x28)
             = (*(double *)((long)local_be8.super_QVLABaseBase.ptr + uVar23 * 8) -
               *(double *)((long)local_be8.super_QVLABaseBase.ptr + ((ulong)uVar38 - 2) * 8)) /
               stack0xfffffffffffff400;
      }
    }
  }
  if ((((0 < iVar19) && (0 < iVar18)) && (0 < (int)uVar43)) && (0 < (int)uVar48)) {
    bVar41 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                    super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x10) == 0;
    pQVar30 = &local_5a0;
    if (bVar41) {
      pQVar30 = &local_ab8;
    }
    local_c38._16_8_ = (double)iVar49;
    local_c38._24_8_ = (double)iVar50;
    local_c38._32_8_ = (double)((ulong)uVar43 | 0x4330000000000000) - 4503599627370496.0;
    uStack_c10 = (double)((ulong)uVar48 | 0x4330000000000000) - 4503599627370496.0;
    auVar55._8_8_ = dVar45;
    auVar55._0_8_ = dVar44;
    auVar56 = divpd(auVar55,register0x00001240);
    _local_c08 = auVar56;
    dVar44 = *(double *)((long)local_b50.super_QVLABaseBase.ptr + uVar29 * 8);
    dVar45 = *(double *)((long)local_b50.super_QVLABaseBase.ptr + ((ulong)uVar31 - 2) * 8);
    dVar46 = *(double *)((long)local_be8.super_QVLABaseBase.ptr + uVar23 * 8);
    dVar9 = *(double *)((long)local_be8.super_QVLABaseBase.ptr + ((ulong)uVar38 - 2) * 8);
    puVar28 = local_588;
    if (bVar41) {
      puVar28 = local_aa0;
    }
    uVar27 = 2;
    if (2 < (int)uVar1) {
      uVar27 = uVar29;
    }
    uVar32 = 2;
    if (2 < (int)uVar2) {
      uVar32 = uVar23;
    }
    uVar23 = 1;
    do {
      lVar26 = uVar23 + 1;
      pdVar3 = (double *)((long)local_be8.super_QVLABaseBase.ptr + uVar23 * 8);
      uVar23 = uVar23 + 1;
      local_c38._8_8_ =
           (*(double *)((long)local_be8.super_QVLABaseBase.ptr + lVar26 * 8) + *pdVar3) * 0.5;
      uVar33 = 1;
      do {
        pQVar24 = &local_5a0;
        if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                   super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x10) == 0) {
          pQVar24 = &local_ab8;
        }
        local_c38._0_8_ =
             (*(double *)((long)local_b50.super_QVLABaseBase.ptr + (uVar33 + 1) * 8) +
             *(double *)((long)local_b50.super_QVLABaseBase.ptr + uVar33 * 8)) * 0.5;
        if ((pQVar24->super_QVLABaseBase).s == (pQVar30->super_QVLABaseBase).a) {
          pPVar35 = (PixmapFragment *)local_c38;
          pPVar37 = &local_88;
          for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
            pPVar37->x = pPVar35->x;
            pPVar35 = (PixmapFragment *)((long)pPVar35 + (ulong)bVar42 * -0x10 + 8);
            pPVar37 = (PixmapFragment *)((long)pPVar37 + (ulong)bVar42 * -0x10 + 8);
          }
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
                    (pQVar30,0x10,puVar28,&local_88);
        }
        else {
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                    (pQVar30,0x10,puVar28,(PixmapFragment *)local_c38);
        }
        uVar33 = uVar33 + 1;
      } while (uVar27 != uVar33);
      if (rules->horizontal == RepeatTile) {
        bVar41 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                        super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x10) == 0;
        pQVar24 = &local_5a0;
        if (bVar41) {
          pQVar24 = &local_ab8;
        }
        pQVar15 = &local_5a0;
        if (bVar41) {
          pQVar15 = &local_ab8;
        }
        *(double *)
         ((long)(pQVar15->super_QVLABaseBase).ptr + (pQVar24->super_QVLABaseBase).s * 0x50 + -0x30)
             = (dVar44 - dVar45) / auVar56._0_8_;
      }
    } while (uVar23 != uVar32);
    if (rules->vertical == RepeatTile) {
      uVar23 = 2;
      if (2 < (int)uVar1) {
        uVar23 = uVar29;
      }
      lVar26 = -1;
      do {
        pQVar30 = &local_5a0;
        pQVar24 = &local_5a0;
        if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                   super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x10) == 0) {
          pQVar30 = &local_ab8;
          pQVar24 = &local_ab8;
        }
        *(double *)
         ((long)(pQVar30->super_QVLABaseBase).ptr +
         ((pQVar24->super_QVLABaseBase).s + lVar26) * 0x50 + 0x28) =
             (dVar46 - dVar9) / auVar56._8_8_;
        lVar26 = lVar26 + -1;
      } while (-lVar26 != uVar23);
    }
  }
  if (local_5a0.super_QVLABaseBase.s != 0) {
    QPainter::drawPixmapFragments
              (painter,local_5a0.super_QVLABaseBase.ptr,local_5a0.super_QVLABaseBase.s,pixmap,1);
  }
  if (local_ab8.super_QVLABaseBase.s != 0) {
    QPainter::drawPixmapFragments
              (painter,local_ab8.super_QVLABaseBase.ptr,local_ab8.super_QVLABaseBase.s,pixmap,0);
  }
  if ((uVar20 & 1) != 0) {
    QPainter::setRenderHint((RenderHint)painter,true);
  }
  if ((double *)local_be8.super_QVLABaseBase.ptr != local_bd0) {
    QtPrivate::sizedFree(local_be8.super_QVLABaseBase.ptr,local_be8.super_QVLABaseBase.a << 3);
  }
  if ((double *)local_b50.super_QVLABaseBase.ptr != local_b38) {
    QtPrivate::sizedFree(local_b50.super_QVLABaseBase.ptr,local_b50.super_QVLABaseBase.a << 3);
  }
  if ((undefined1 *)local_ab8.super_QVLABaseBase.ptr != local_aa0) {
    QtPrivate::sizedFree(local_ab8.super_QVLABaseBase.ptr,local_ab8.super_QVLABaseBase.a * 0x50);
  }
  if ((undefined1 *)local_5a0.super_QVLABaseBase.ptr != local_588) {
    QtPrivate::sizedFree(local_5a0.super_QVLABaseBase.ptr,local_5a0.super_QVLABaseBase.a * 0x50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qDrawBorderPixmap(QPainter *painter, const QRect &targetRect, const QMargins &targetMargins,
                       const QPixmap &pixmap, const QRect &sourceRect,const QMargins &sourceMargins,
                       const QTileRules &rules
#ifndef Q_QDOC
                       , QDrawBorderPixmap::DrawingHints hints
#endif
                       )
{
    QPainter::PixmapFragment d;
    d.opacity = 1.0;
    d.rotation = 0.0;

    QPixmapFragmentsArray opaqueData;
    QPixmapFragmentsArray translucentData;

    // source center
    const int sourceCenterTop = sourceRect.top() + sourceMargins.top();
    const int sourceCenterLeft = sourceRect.left() + sourceMargins.left();
    const int sourceCenterBottom = sourceRect.bottom() - sourceMargins.bottom() + 1;
    const int sourceCenterRight = sourceRect.right() - sourceMargins.right() + 1;
    const int sourceCenterWidth = sourceCenterRight - sourceCenterLeft;
    const int sourceCenterHeight = sourceCenterBottom - sourceCenterTop;
    // target center
    const int targetCenterTop = targetRect.top() + targetMargins.top();
    const int targetCenterLeft = targetRect.left() + targetMargins.left();
    const int targetCenterBottom = targetRect.bottom() - targetMargins.bottom() + 1;
    const int targetCenterRight = targetRect.right() - targetMargins.right() + 1;
    const int targetCenterWidth = targetCenterRight - targetCenterLeft;
    const int targetCenterHeight = targetCenterBottom - targetCenterTop;

    QVarLengthArray<qreal, 16> xTarget; // x-coordinates of target rectangles
    QVarLengthArray<qreal, 16> yTarget; // y-coordinates of target rectangles

    int columns = 3;
    int rows = 3;
    if (rules.horizontal != Qt::StretchTile && sourceCenterWidth != 0)
        columns = qMax(3, 2 + qCeil(targetCenterWidth / qreal(sourceCenterWidth)));
    if (rules.vertical != Qt::StretchTile && sourceCenterHeight != 0)
        rows = qMax(3, 2 + qCeil(targetCenterHeight / qreal(sourceCenterHeight)));

    xTarget.resize(columns + 1);
    yTarget.resize(rows + 1);

    bool oldAA = painter->testRenderHint(QPainter::Antialiasing);
    if (painter->paintEngine()->type() != QPaintEngine::OpenGL
        && painter->paintEngine()->type() != QPaintEngine::OpenGL2
        && oldAA && painter->combinedTransform().type() != QTransform::TxNone) {
        painter->setRenderHint(QPainter::Antialiasing, false);
    }

    xTarget[0] = targetRect.left();
    xTarget[1] = targetCenterLeft;
    xTarget[columns - 1] = targetCenterRight;
    xTarget[columns] = targetRect.left() + targetRect.width();

    yTarget[0] = targetRect.top();
    yTarget[1] = targetCenterTop;
    yTarget[rows - 1] = targetCenterBottom;
    yTarget[rows] = targetRect.top() + targetRect.height();

    qreal dx = targetCenterWidth;
    qreal dy = targetCenterHeight;

    switch (rules.horizontal) {
    case Qt::StretchTile:
        dx = targetCenterWidth;
        break;
    case Qt::RepeatTile:
        dx = sourceCenterWidth;
        break;
    case Qt::RoundTile:
        dx = targetCenterWidth / qreal(columns - 2);
        break;
    }

    for (int i = 2; i < columns - 1; ++i)
        xTarget[i] = xTarget[i - 1] + dx;

    switch (rules.vertical) {
    case Qt::StretchTile:
        dy = targetCenterHeight;
        break;
    case Qt::RepeatTile:
        dy = sourceCenterHeight;
        break;
    case Qt::RoundTile:
        dy = targetCenterHeight / qreal(rows - 2);
        break;
    }

    for (int i = 2; i < rows - 1; ++i)
        yTarget[i] = yTarget[i - 1] + dy;

    // corners
    if (targetMargins.top() > 0 && targetMargins.left() > 0 && sourceMargins.top() > 0 && sourceMargins.left() > 0) { // top left
        d.x = (0.5 * (xTarget[1] + xTarget[0]));
        d.y = (0.5 * (yTarget[1] + yTarget[0]));
        d.sourceLeft = sourceRect.left();
        d.sourceTop = sourceRect.top();
        d.width = sourceMargins.left();
        d.height = sourceMargins.top();
        d.scaleX = qreal(xTarget[1] - xTarget[0]) / d.width;
        d.scaleY = qreal(yTarget[1] - yTarget[0]) / d.height;
        if (hints & QDrawBorderPixmap::OpaqueTopLeft)
            opaqueData.append(d);
        else
            translucentData.append(d);
    }
    if (targetMargins.top() > 0 && targetMargins.right() > 0 && sourceMargins.top() > 0 && sourceMargins.right() > 0) { // top right
        d.x = (0.5 * (xTarget[columns] + xTarget[columns - 1]));
        d.y = (0.5 * (yTarget[1] + yTarget[0]));
        d.sourceLeft = sourceCenterRight;
        d.sourceTop = sourceRect.top();
        d.width = sourceMargins.right();
        d.height = sourceMargins.top();
        d.scaleX = qreal(xTarget[columns] - xTarget[columns - 1]) / d.width;
        d.scaleY = qreal(yTarget[1] - yTarget[0]) / d.height;
        if (hints & QDrawBorderPixmap::OpaqueTopRight)
            opaqueData.append(d);
        else
            translucentData.append(d);
    }
    if (targetMargins.bottom() > 0 && targetMargins.left() > 0 && sourceMargins.bottom() > 0 && sourceMargins.left() > 0) { // bottom left
        d.x = (0.5 * (xTarget[1] + xTarget[0]));
        d.y =(0.5 * (yTarget[rows] + yTarget[rows - 1]));
        d.sourceLeft = sourceRect.left();
        d.sourceTop = sourceCenterBottom;
        d.width = sourceMargins.left();
        d.height = sourceMargins.bottom();
        d.scaleX = qreal(xTarget[1] - xTarget[0]) / d.width;
        d.scaleY = qreal(yTarget[rows] - yTarget[rows - 1]) / d.height;
        if (hints & QDrawBorderPixmap::OpaqueBottomLeft)
            opaqueData.append(d);
        else
            translucentData.append(d);
    }
    if (targetMargins.bottom() > 0 && targetMargins.right() > 0 && sourceMargins.bottom() > 0 && sourceMargins.right() > 0) { // bottom right
        d.x = (0.5 * (xTarget[columns] + xTarget[columns - 1]));
        d.y = (0.5 * (yTarget[rows] + yTarget[rows - 1]));
        d.sourceLeft = sourceCenterRight;
        d.sourceTop = sourceCenterBottom;
        d.width = sourceMargins.right();
        d.height = sourceMargins.bottom();
        d.scaleX = qreal(xTarget[columns] - xTarget[columns - 1]) / d.width;
        d.scaleY = qreal(yTarget[rows] - yTarget[rows - 1]) / d.height;
        if (hints & QDrawBorderPixmap::OpaqueBottomRight)
            opaqueData.append(d);
        else
            translucentData.append(d);
    }

    // horizontal edges
    if (targetCenterWidth > 0 && sourceCenterWidth > 0) {
        if (targetMargins.top() > 0 && sourceMargins.top() > 0) { // top
            QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueTop ? opaqueData : translucentData;
            d.sourceLeft = sourceCenterLeft;
            d.sourceTop = sourceRect.top();
            d.width = sourceCenterWidth;
            d.height = sourceMargins.top();
            d.y = (0.5 * (yTarget[1] + yTarget[0]));
            d.scaleX = dx / d.width;
            d.scaleY = qreal(yTarget[1] - yTarget[0]) / d.height;
            for (int i = 1; i < columns - 1; ++i) {
                d.x = (0.5 * (xTarget[i + 1] + xTarget[i]));
                data.append(d);
            }
            if (rules.horizontal == Qt::RepeatTile)
                data[data.size() - 1].width = ((xTarget[columns - 1] - xTarget[columns - 2]) / d.scaleX);
        }
        if (targetMargins.bottom() > 0 && sourceMargins.bottom() > 0) { // bottom
            QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueBottom ? opaqueData : translucentData;
            d.sourceLeft = sourceCenterLeft;
            d.sourceTop = sourceCenterBottom;
            d.width = sourceCenterWidth;
            d.height = sourceMargins.bottom();
            d.y = (0.5 * (yTarget[rows] + yTarget[rows - 1]));
            d.scaleX = dx / d.width;
            d.scaleY = qreal(yTarget[rows] - yTarget[rows - 1]) / d.height;
            for (int i = 1; i < columns - 1; ++i) {
                d.x = (0.5 * (xTarget[i + 1] + xTarget[i]));
                data.append(d);
            }
            if (rules.horizontal == Qt::RepeatTile)
                data[data.size() - 1].width = ((xTarget[columns - 1] - xTarget[columns - 2]) / d.scaleX);
        }
    }

    // vertical edges
    if (targetCenterHeight > 0 && sourceCenterHeight > 0) {
        if (targetMargins.left() > 0 && sourceMargins.left() > 0) { // left
            QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueLeft ? opaqueData : translucentData;
            d.sourceLeft = sourceRect.left();
            d.sourceTop = sourceCenterTop;
            d.width = sourceMargins.left();
            d.height = sourceCenterHeight;
            d.x = (0.5 * (xTarget[1] + xTarget[0]));
            d.scaleX = qreal(xTarget[1] - xTarget[0]) / d.width;
            d.scaleY = dy / d.height;
            for (int i = 1; i < rows - 1; ++i) {
                d.y = (0.5 * (yTarget[i + 1] + yTarget[i]));
                data.append(d);
            }
            if (rules.vertical == Qt::RepeatTile)
                data[data.size() - 1].height = ((yTarget[rows - 1] - yTarget[rows - 2]) / d.scaleY);
        }
        if (targetMargins.right() > 0 && sourceMargins.right() > 0) { // right
            QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueRight ? opaqueData : translucentData;
            d.sourceLeft = sourceCenterRight;
            d.sourceTop = sourceCenterTop;
            d.width = sourceMargins.right();
            d.height = sourceCenterHeight;
            d.x = (0.5 * (xTarget[columns] + xTarget[columns - 1]));
            d.scaleX = qreal(xTarget[columns] - xTarget[columns - 1]) / d.width;
            d.scaleY = dy / d.height;
            for (int i = 1; i < rows - 1; ++i) {
                d.y = (0.5 * (yTarget[i + 1] + yTarget[i]));
                data.append(d);
            }
            if (rules.vertical == Qt::RepeatTile)
                data[data.size() - 1].height = ((yTarget[rows - 1] - yTarget[rows - 2]) / d.scaleY);
        }
    }

    // center
    if (targetCenterWidth > 0 && targetCenterHeight > 0 && sourceCenterWidth > 0 && sourceCenterHeight > 0) {
        QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueCenter ? opaqueData : translucentData;
        d.sourceLeft = sourceCenterLeft;
        d.sourceTop = sourceCenterTop;
        d.width = sourceCenterWidth;
        d.height = sourceCenterHeight;
        d.scaleX = dx / d.width;
        d.scaleY = dy / d.height;

        qreal repeatWidth = (xTarget[columns - 1] - xTarget[columns - 2]) / d.scaleX;
        qreal repeatHeight = (yTarget[rows - 1] - yTarget[rows - 2]) / d.scaleY;

        for (int j = 1; j < rows - 1; ++j) {
            d.y = (0.5 * (yTarget[j + 1] + yTarget[j]));
            for (int i = 1; i < columns - 1; ++i) {
                d.x = (0.5 * (xTarget[i + 1] + xTarget[i]));
                data.append(d);
            }
            if (rules.horizontal == Qt::RepeatTile)
                data[data.size() - 1].width = repeatWidth;
        }
        if (rules.vertical == Qt::RepeatTile) {
            for (int i = 1; i < columns - 1; ++i)
                data[data.size() - i].height = repeatHeight;
        }
    }

    if (opaqueData.size())
        painter->drawPixmapFragments(opaqueData.data(), opaqueData.size(), pixmap, QPainter::OpaqueHint);
    if (translucentData.size())
        painter->drawPixmapFragments(translucentData.data(), translucentData.size(), pixmap);

    if (oldAA)
        painter->setRenderHint(QPainter::Antialiasing, true);
}